

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

LogMessage * pfederc::logLexerError(LogMessage *__return_storage_ptr__,Lexer *lexer,LexerError *err)

{
  initializer_list<pfederc::LogMessage> __l;
  initializer_list<pfederc::LogMessage> __l_00;
  initializer_list<pfederc::LogMessage> __l_01;
  Position *pPVar1;
  LexerError *pLVar2;
  Level LVar3;
  LexerErrorCode LVar4;
  LogMessage *local_748;
  LogMessage *local_6e0;
  LogMessage *local_698;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_5c8;
  allocator<char> local_5a9;
  string local_5a8;
  string local_588;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_568;
  allocator<char> local_549;
  string local_548;
  string local_528;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_508;
  allocator<char> local_4e9;
  string local_4e8;
  string local_4c8;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_4a8;
  allocator<char> local_489;
  string local_488;
  string local_468;
  allocator<pfederc::LogMessage> local_441;
  LogMessage local_440;
  undefined1 local_3f8 [47];
  allocator<char> local_3c9;
  string local_3c8;
  string local_3a8;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_388;
  allocator<char> local_369;
  string local_368;
  string local_348;
  allocator<pfederc::LogMessage> local_321;
  LogMessage local_320;
  undefined1 local_2d8 [47];
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  allocator<pfederc::LogMessage> local_261;
  LogMessage local_260;
  undefined1 local_218 [47];
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_1a8;
  allocator<char> local_189;
  string local_188;
  string local_168;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_148;
  allocator<char> local_129;
  string local_128;
  string local_108;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_e8;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_88;
  allocator<char> local_69;
  string local_68;
  string local_48;
  Position *local_28;
  Position *pos;
  LexerError *err_local;
  Lexer *lexer_local;
  
  pos = (Position *)err;
  err_local = (LexerError *)lexer;
  lexer_local = (Lexer *)__return_storage_ptr__;
  local_28 = Error<pfederc::LexerErrorCode>::getPosition(err);
  LVar4 = Error<pfederc::LexerErrorCode>::getErrorCode((Error<pfederc::LexerErrorCode> *)pos);
  switch(LVar4) {
  case LEX_ERR_GENERAL_INVALID_CHARACTER:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Invalid character",&local_69);
    logCreateErrorMessage(&local_48,(Lexer *)pLVar2,pPVar1,&local_68);
    memset(&local_88,0,0x18);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&local_88);
    LogMessage::LogMessage(__return_storage_ptr__,LVar3,&local_48,&local_88);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    break;
  case LEX_ERR_ID_NO_DIGIT_AFTER_ANYS:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Leading _ must not be followed by digit",&local_c9);
    logCreateErrorMessage(&local_a8,(Lexer *)pLVar2,pPVar1,&local_c8);
    memset(&local_e8,0,0x18);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&local_e8);
    LogMessage::LogMessage(__return_storage_ptr__,LVar3,&local_a8,&local_e8);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_e8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    break;
  case LEX_ERR_ID_NOT_JUST_ANYS:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"Identifier must not consist of just _",&local_129);
    logCreateErrorMessage(&local_108,(Lexer *)pLVar2,pPVar1,&local_128);
    memset(&local_148,0,0x18);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&local_148);
    LogMessage::LogMessage(__return_storage_ptr__,LVar3,&local_108,&local_148);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_148);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    break;
  case LEX_ERR_STR_INVALID_ESCAPE_CODE:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"Invalid escape sequence",&local_189);
    logCreateErrorMessage(&local_168,(Lexer *)pLVar2,pPVar1,&local_188);
    memset(&local_1a8,0,0x18);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&local_1a8);
    LogMessage::LogMessage(__return_storage_ptr__,LVar3,&local_168,&local_1a8);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_1a8);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    break;
  case LEX_ERR_CHAR_INVALID_END:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"Expected \'",&local_1e9);
    logCreateErrorMessage(&local_1c8,(Lexer *)pLVar2,pPVar1,&local_1e8);
    _logLexerErrorCharInvalidEnd(&local_260,(Lexer *)err_local,(LexerError *)pos);
    local_218._8_8_ = 1;
    local_218._0_8_ = &local_260;
    std::allocator<pfederc::LogMessage>::allocator(&local_261);
    __l_01._M_len = local_218._8_8_;
    __l_01._M_array = (iterator)local_218._0_8_;
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)
               (local_218 + 0x10),__l_01,&local_261);
    LogMessage::LogMessage
              (__return_storage_ptr__,LVar3,&local_1c8,
               (vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)
               (local_218 + 0x10));
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)
               (local_218 + 0x10));
    std::allocator<pfederc::LogMessage>::~allocator(&local_261);
    local_698 = (LogMessage *)local_218;
    do {
      local_698 = local_698 + -1;
      LogMessage::~LogMessage(local_698);
    } while (local_698 != &local_260);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    break;
  case LEX_ERR_STR_INVALID_END:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"Expected \"",&local_2a9);
    logCreateErrorMessage(&local_288,(Lexer *)pLVar2,pPVar1,&local_2a8);
    _logLexerErrorStrInvalidEnd(&local_320,(Lexer *)err_local,(LexerError *)pos);
    local_2d8._8_8_ = 1;
    local_2d8._0_8_ = &local_320;
    std::allocator<pfederc::LogMessage>::allocator(&local_321);
    __l_00._M_len = local_2d8._8_8_;
    __l_00._M_array = (iterator)local_2d8._0_8_;
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)
               (local_2d8 + 0x10),__l_00,&local_321);
    LogMessage::LogMessage
              (__return_storage_ptr__,LVar3,&local_288,
               (vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)
               (local_2d8 + 0x10));
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)
               (local_2d8 + 0x10));
    std::allocator<pfederc::LogMessage>::~allocator(&local_321);
    local_6e0 = (LogMessage *)local_2d8;
    do {
      local_6e0 = local_6e0 + -1;
      LogMessage::~LogMessage(local_6e0);
    } while (local_6e0 != &local_320);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    break;
  case LEX_ERR_STR_HEXADECIMAL_CHAR:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"Expected hexadecimal character",&local_369);
    logCreateErrorMessage(&local_348,(Lexer *)pLVar2,pPVar1,&local_368);
    memset(&local_388,0,0x18);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&local_388);
    LogMessage::LogMessage(__return_storage_ptr__,LVar3,&local_348,&local_388);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_388);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    break;
  case LEX_ERR_NUM_LEADING_ZERO:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"Zero must not be the first character of decimal number",
               &local_3c9);
    logCreateErrorMessage(&local_3a8,(Lexer *)pLVar2,pPVar1,&local_3c8);
    _logLexerErrorLeadingZero(&local_440,(Lexer *)err_local,(LexerError *)pos);
    local_3f8._8_8_ = 1;
    local_3f8._0_8_ = &local_440;
    std::allocator<pfederc::LogMessage>::allocator(&local_441);
    __l._M_len = local_3f8._8_8_;
    __l._M_array = (iterator)local_3f8._0_8_;
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)
               (local_3f8 + 0x10),__l,&local_441);
    LogMessage::LogMessage
              (__return_storage_ptr__,LVar3,&local_3a8,
               (vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)
               (local_3f8 + 0x10));
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)
               (local_3f8 + 0x10));
    std::allocator<pfederc::LogMessage>::~allocator(&local_441);
    local_748 = (LogMessage *)local_3f8;
    do {
      local_748 = local_748 + -1;
      LogMessage::~LogMessage(local_748);
    } while (local_748 != &local_440);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    break;
  case LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"Unexpected digit",&local_489);
    logCreateErrorMessage(&local_468,(Lexer *)pLVar2,pPVar1,&local_488);
    memset(&local_4a8,0,0x18);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&local_4a8);
    LogMessage::LogMessage(__return_storage_ptr__,LVar3,&local_468,&local_4a8);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_4a8);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator(&local_489);
    break;
  case LEX_ERR_NUM_UNEXPECTED_CHAR:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,"Unexpected character",&local_4e9);
    logCreateErrorMessage(&local_4c8,(Lexer *)pLVar2,pPVar1,&local_4e8);
    memset(&local_508,0,0x18);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&local_508);
    LogMessage::LogMessage(__return_storage_ptr__,LVar3,&local_4c8,&local_508);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_508);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    break;
  case LEX_ERR_REGION_COMMENT_END:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_548,"Expected \'*/\'",&local_549);
    logCreateErrorMessage(&local_528,(Lexer *)pLVar2,pPVar1,&local_548);
    memset(&local_568,0,0x18);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&local_568);
    LogMessage::LogMessage(__return_storage_ptr__,LVar3,&local_528,&local_568);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_568);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    break;
  default:
    LVar3 = Error<pfederc::LexerErrorCode>::getLogLevel((Error<pfederc::LexerErrorCode> *)pos);
    pLVar2 = err_local;
    pPVar1 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a8,"Unknown error",&local_5a9);
    logCreateErrorMessage(&local_588,(Lexer *)pLVar2,pPVar1,&local_5a8);
    memset(&local_5c8,0,0x18);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&local_5c8);
    LogMessage::LogMessage(__return_storage_ptr__,LVar3,&local_588,&local_5c8);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_5c8);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
  }
  return __return_storage_ptr__;
}

Assistant:

LogMessage pfederc::logLexerError(const Lexer &lexer, const LexerError &err) noexcept {
  const Position &pos = err.getPosition();
  switch (err.getErrorCode()) {
  case LexerErrorCode::LEX_ERR_GENERAL_INVALID_CHARACTER:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Invalid character"));  
  case LexerErrorCode::LEX_ERR_ID_NO_DIGIT_AFTER_ANYS:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Leading _ must not be followed by digit"));  
  case LexerErrorCode::LEX_ERR_ID_NOT_JUST_ANYS:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Identifier must not consist of just _"));  
  case LexerErrorCode::LEX_ERR_STR_INVALID_ESCAPE_CODE:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Invalid escape sequence"));  
  case LexerErrorCode::LEX_ERR_CHAR_INVALID_END:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Expected '"),
      { _logLexerErrorCharInvalidEnd(lexer, err) });  
  case LexerErrorCode::LEX_ERR_STR_INVALID_END:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Expected \""),
      { _logLexerErrorStrInvalidEnd(lexer, err) });  
  case LexerErrorCode::LEX_ERR_STR_HEXADECIMAL_CHAR:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Expected hexadecimal character"));
  case LexerErrorCode::LEX_ERR_NUM_LEADING_ZERO:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Zero must not be the first character of decimal number"),
      { _logLexerErrorLeadingZero(lexer, err) });  
  case LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Unexpected digit"));  
  case LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR:
    return LogMessage(err.getLogLevel(), logCreateErrorMessage(lexer, pos, "Unexpected character"));  
  case LexerErrorCode::LEX_ERR_REGION_COMMENT_END:
    return LogMessage(err.getLogLevel(), logCreateErrorMessage(lexer, pos, "Expected '*/'"));
  default:
    return LogMessage(err.getLogLevel(), logCreateErrorMessage(lexer, pos, "Unknown error"));
  }
}